

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::TryTableExpr::TryTableExpr(TryTableExpr *this,Location *loc)

{
  Location *loc_local;
  TryTableExpr *this_local;
  
  ExprMixin<(wabt::ExprType)62>::ExprMixin(&this->super_ExprMixin<(wabt::ExprType)62>,loc);
  (this->super_ExprMixin<(wabt::ExprType)62>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__TryTableExpr_00280588;
  Block::Block(&this->block);
  std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>::vector(&this->catches);
  return;
}

Assistant:

explicit TryTableExpr(const Location& loc = Location())
      : ExprMixin<ExprType::TryTable>(loc) {}